

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsplashscreen.cpp
# Opt level: O0

void __thiscall QSplashScreen::drawContents(QSplashScreen *this,QPainter *painter)

{
  int iVar1;
  QSplashScreenPrivate *pQVar2;
  ulong uVar3;
  QRect *in_RSI;
  QRect *in_RDI;
  long in_FS_OFFSET;
  QSplashScreenPrivate *d;
  QSizeF txtSize;
  QTextCursor cursor;
  QTextDocument doc;
  QRect r;
  QTextBlockFormat fmt;
  undefined4 in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  QRect *in_stack_ffffffffffffff20;
  QPoint *in_stack_ffffffffffffff28;
  QAnyStringView *in_stack_ffffffffffffff30;
  QWidget *in_stack_ffffffffffffff38;
  QRectF local_a0;
  QPoint local_80;
  QSizeF local_78;
  QFlag local_68 [2];
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  QAnyStringView *local_48;
  QRect local_38;
  undefined1 local_28 [16];
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QSplashScreen *)0x697255);
  QPainter::setPen((QColor *)in_RSI);
  local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_28._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = QWidget::rect(in_stack_ffffffffffffff38);
  local_28 = (undefined1  [16])
             QRect::adjusted(in_RDI,(int)((ulong)in_RSI >> 0x20),(int)in_RSI,
                             (int)((ulong)pQVar2 >> 0x20),(int)pQVar2);
  QAnyStringView::QAnyStringView(in_stack_ffffffffffffff30,(QString *)in_stack_ffffffffffffff28);
  uVar3 = Qt::mightBeRichText(local_48);
  if ((uVar3 & 1) == 0) {
    QPainter::drawText(in_RSI,(int)local_28,(QString *)(ulong)(uint)pQVar2->currAlign,
                       (QRect *)&pQVar2->currStatus);
  }
  else {
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    local_50 = &DAT_aaaaaaaaaaaaaaaa;
    QTextDocument::QTextDocument((QTextDocument *)&local_58,(QObject *)0x0);
    QTextDocument::setHtml((QString *)&local_58);
    iVar1 = QRect::width((QRect *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    QTextDocument::setTextWidth((double)iVar1);
    local_60 = &DAT_aaaaaaaaaaaaaaaa;
    QTextCursor::QTextCursor((QTextCursor *)&local_60,(QTextDocument *)&local_58);
    QTextCursor::select((SelectionType)&local_60);
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QTextBlockFormat::QTextBlockFormat((QTextBlockFormat *)&local_18);
    QFlag::QFlag(local_68,pQVar2->currAlign);
    QFlags<Qt::AlignmentFlag>::QFlagsStorageHelper
              ((QFlags<Qt::AlignmentFlag> *)
               CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
               (QFlag)(int)((ulong)in_stack_ffffffffffffff20 >> 0x20));
    QTextBlockFormat::setAlignment
              ((QTextBlockFormat *)in_stack_ffffffffffffff20,
               (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
               SUB84((ulong)in_stack_ffffffffffffff28 >> 0x20,0));
    QWidget::layoutDirection((QWidget *)0x69741d);
    QTextFormat::setLayoutDirection
              ((QTextFormat *)in_stack_ffffffffffffff28,
               (LayoutDirection)((ulong)in_stack_ffffffffffffff20 >> 0x20));
    QTextCursor::mergeBlockFormat((QTextBlockFormat *)&local_60);
    local_78.wd = -NAN;
    local_78.ht = -NAN;
    local_78.wd = (qreal)QTextDocument::size();
    if ((pQVar2->currAlign & 0x40U) == 0) {
      if ((pQVar2->currAlign & 0x80U) != 0) {
        iVar1 = QRect::height((QRect *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18)
                             );
        in_stack_ffffffffffffff30 = (QAnyStringView *)(double)(iVar1 / 2);
        QSizeF::height(&local_78);
        QRect::setTop(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
      }
    }
    else {
      QRect::height((QRect *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      QSizeF::height(&local_78);
      QRect::setTop(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
    }
    QPainter::save();
    local_80 = QRect::topLeft((QRect *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18)
                             );
    QPainter::translate((QPainter *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    QRectF::QRectF(&local_a0);
    QTextDocument::drawContents((QPainter *)&local_58,(QRectF *)in_RSI);
    QPainter::restore();
    QTextBlockFormat::~QTextBlockFormat((QTextBlockFormat *)0x6975a7);
    QTextCursor::~QTextCursor((QTextCursor *)&local_60);
    QTextDocument::~QTextDocument((QTextDocument *)&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSplashScreen::drawContents(QPainter *painter)
{
    Q_D(QSplashScreen);
    painter->setPen(d->currColor);
    QRect r = rect().adjusted(5, 5, -5, -5);
    if (Qt::mightBeRichText(d->currStatus)) {
        QTextDocument doc;
#ifdef QT_NO_TEXTHTMLPARSER
        doc.setPlainText(d->currStatus);
#else
        doc.setHtml(d->currStatus);
#endif
        doc.setTextWidth(r.width());
        QTextCursor cursor(&doc);
        cursor.select(QTextCursor::Document);
        QTextBlockFormat fmt;
        fmt.setAlignment(Qt::Alignment(d->currAlign));
        fmt.setLayoutDirection(layoutDirection());
        cursor.mergeBlockFormat(fmt);
        const QSizeF txtSize = doc.size();
        if (d->currAlign & Qt::AlignBottom)
            r.setTop(r.height() - txtSize.height());
        else if (d->currAlign & Qt::AlignVCenter)
            r.setTop(r.height() / 2 - txtSize.height() / 2);
        painter->save();
        painter->translate(r.topLeft());
        doc.drawContents(painter);
        painter->restore();
    } else {
        painter->drawText(r, d->currAlign, d->currStatus);
    }
}